

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCec.c
# Opt level: O0

Aig_Man_t * Cec_LatchCorrespondence(Aig_Man_t *pAig,int nConfs,int fUseCSat)

{
  Aig_Man_t *pAVar1;
  Cec_ParCor_t *pCorPars;
  Cec_ParCor_t CorPars;
  Gia_Man_t *pGia;
  int fUseCSat_local;
  int nConfs_local;
  Aig_Man_t *pAig_local;
  
  Cec_ManCorSetDefaultParams((Cec_ParCor_t *)&pCorPars);
  CorPars.nLevelMax = 1;
  CorPars.nFrames = nConfs;
  CorPars.fUseRings = fUseCSat;
  CorPars.pFunc = Gia_ManFromAigSimple(pAig);
  Cec_ManLSCorrespondenceClasses((Gia_Man_t *)CorPars.pFunc,(Cec_ParCor_t *)&pCorPars);
  Gia_ManReprToAigRepr(pAig,(Gia_Man_t *)CorPars.pFunc);
  Gia_ManStop((Gia_Man_t *)CorPars.pFunc);
  pAVar1 = Aig_ManDupSimple(pAig);
  return pAVar1;
}

Assistant:

Aig_Man_t * Cec_LatchCorrespondence( Aig_Man_t * pAig, int nConfs, int fUseCSat )
{
    Gia_Man_t * pGia;
    Cec_ParCor_t CorPars, * pCorPars = &CorPars;
    Cec_ManCorSetDefaultParams( pCorPars );
    pCorPars->fLatchCorr = 1;
    pCorPars->fUseCSat   = fUseCSat;
    pCorPars->nBTLimit   = nConfs;
    pGia = Gia_ManFromAigSimple( pAig );
    Cec_ManLSCorrespondenceClasses( pGia, pCorPars );
    Gia_ManReprToAigRepr( pAig, pGia );
    Gia_ManStop( pGia );
    return Aig_ManDupSimple( pAig );
}